

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O1

void maxHeapsort(double *heap_v,HighsInt *heap_i,HighsInt n)

{
  double dVar1;
  HighsInt HVar2;
  bool bVar3;
  HighsInt i;
  ulong uVar4;
  
  if (1 < n) {
    uVar4 = (ulong)(uint)n;
    do {
      dVar1 = heap_v[uVar4];
      heap_v[uVar4] = heap_v[1];
      heap_v[1] = dVar1;
      HVar2 = heap_i[uVar4];
      heap_i[uVar4] = heap_i[1];
      heap_i[1] = HVar2;
      maxHeapify(heap_v,heap_i,1,(HighsInt)(uVar4 - 1));
      bVar3 = 2 < (long)uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void maxHeapsort(double* heap_v, HighsInt* heap_i, HighsInt n) {
  double temp_v;
  HighsInt i, temp_i;
  for (i = n; i >= 2; i--) {
    temp_v = heap_v[i];
    heap_v[i] = heap_v[1];
    heap_v[1] = temp_v;
    temp_i = heap_i[i];
    heap_i[i] = heap_i[1];
    heap_i[1] = temp_i;
    maxHeapify(heap_v, heap_i, 1, i - 1);
  }
}